

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-defend.c
# Opt level: O3

wchar_t borg_calculate_defense_effectiveness(wchar_t what,wchar_t p1)

{
  ushort uVar1;
  ushort uVar2;
  undefined4 uVar3;
  loc_conflict grid1;
  loc_conflict grid1_00;
  loc_conflict grid1_01;
  loc_conflict grid2;
  loc_conflict grid1_02;
  loc_conflict grid1_03;
  loc_conflict grid1_04;
  loc_conflict grid1_05;
  loc_conflict grid1_06;
  borg_item_conflict *pbVar4;
  _Bool *p_Var5;
  _Bool _Var6;
  _Bool _Var7;
  _Bool _Var8;
  _Bool _Var9;
  byte bVar10;
  char cVar11;
  int16_t iVar12;
  int iVar13;
  wchar_t wVar14;
  wchar_t wVar15;
  uint uVar16;
  uint uVar17;
  wchar_t wVar18;
  ulong uVar19;
  int *piVar20;
  char *pcVar21;
  wchar_t *pwVar22;
  char cVar23;
  short sVar24;
  int iVar25;
  uint *puVar26;
  borg_kill *pbVar27;
  borg_kill *pbVar28;
  wchar_t wVar29;
  wchar_t wVar30;
  ulong uVar31;
  monster_race *pmVar32;
  long lVar33;
  int iVar34;
  uint uVar35;
  long lVar36;
  ulong uVar37;
  keycode_t k;
  char *fmt;
  char cVar38;
  borg_grid *pbVar39;
  ulong uVar40;
  bool bVar41;
  bool bVar42;
  wchar_t b_kill_count [255];
  wchar_t b_danger [255];
  ulong local_c68;
  int local_c5c;
  _Bool *local_c58;
  wchar_t local_c50;
  int local_c4c;
  int local_c48;
  wchar_t local_c38 [256];
  uint local_838 [256];
  wchar_t local_438 [258];
  
  iVar13 = borg.c.y;
  iVar34 = borg.c.x;
  puVar26 = &switchD_0020ff36::switchdataD_00284030;
  switch(what) {
  case L'\0':
    if ((((!borg.temp.bless) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
       ((borg.trait[0x79] == 0 &&
        (((borg_grids[borg.c.y][borg.c.x].info & 2) != 0 || (borg.trait[0x1a] != 0)))))) {
      _Var7 = borg_spell_okay_fail(BLESS,L'\x19');
      if ((!_Var7) &&
         (((_Var7 = borg_equips_item(act_blessing,true), !_Var7 &&
           (_Var7 = borg_equips_item(act_blessing2,true), !_Var7)) &&
          ((_Var7 = borg_equips_item(act_blessing3,true), !_Var7 &&
           (((wVar15 = borg_slot(L'\x19',sv_scroll_blessing), wVar15 == L'\xffffffff' &&
             (wVar15 = borg_slot(L'\x19',sv_scroll_holy_chant), wVar15 == L'\xffffffff')) &&
            (wVar15 = borg_slot(L'\x19',sv_scroll_holy_prayer), wVar15 == L'\xffffffff')))))))) {
        return L'\0';
      }
      if (borg_kills_nxt < 2) {
        bVar10 = 0;
      }
      else {
        lVar36 = 1;
        lVar33 = 0x1d8;
        bVar10 = 0;
        pbVar27 = borg_kills;
        iVar12 = borg_kills_nxt;
        do {
          if ((*(short *)(pbVar27->spell + lVar33 + -0x19) != 0) &&
             (borg_t + -5 <= (int)*(short *)((long)&pbVar27->when + lVar33))) {
            grid1.y = borg.c.y;
            grid1.x = borg.c.x;
            wVar15 = distance(grid1,*(loc_conflict *)(pbVar27->spell + lVar33 + -0xd));
            bVar10 = bVar10 | wVar15 < L'\x04';
            pbVar27 = borg_kills;
            iVar12 = borg_kills_nxt;
          }
          lVar36 = lVar36 + 1;
          lVar33 = lVar33 + 0x1d8;
        } while (lVar36 < iVar12);
      }
      if ((int)avoidance / 0xc < p1) {
        bVar42 = L'\0' < p1;
      }
      else {
        bVar42 = L'\0' < p1 && borg.trait[0x23] < 0x10;
      }
      if (((bool)(bVar42 & bVar10)) && (p1 < (int)(short)(avoidance - (avoidance >> 0xf)) >> 1)) {
        wVar15 = L'\x01';
        if (borg_simulate != false) {
          return L'\x01';
        }
        borg_note("# Attempting to cast Bless");
        borg.no_rest_prep = 11000;
        _Var7 = borg_spell(BLESS);
        if (_Var7) {
          return L'\x01';
        }
        _Var7 = borg_activate_item(act_blessing);
        if (_Var7) {
          return L'\x01';
        }
        _Var7 = borg_activate_item(act_blessing2);
        if (_Var7) {
          return L'\x01';
        }
        _Var7 = borg_activate_item(act_blessing3);
        if (_Var7) {
          return L'\x01';
        }
        _Var7 = borg_read_scroll(sv_scroll_blessing);
        if (_Var7) {
          return L'\x01';
        }
        _Var7 = borg_read_scroll(sv_scroll_holy_chant);
        if (_Var7) {
          return L'\x01';
        }
        _Var7 = borg_read_scroll(sv_scroll_holy_prayer);
        goto LAB_002125b1;
      }
    }
    break;
  case L'\x01':
    if (((!borg.temp.fast) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      wVar15 = L'\x06';
      if ((p1 <= avoidance) && (wVar15 = L'\x0f', p1 <= (avoidance * 2) / 3)) {
        wVar15 = L'\x19';
        if (p1 < avoidance / 3) {
          wVar15 = L'#';
        }
      }
      _Var7 = borg_spell_okay_fail(HASTE_SELF,wVar15);
      _Var8 = borg_equips_staff_fail(sv_staff_speed);
      _Var9 = borg_equips_rod(sv_rod_speed);
      wVar18 = borg_slot(L'\x1a',sv_potion_speed);
      if (((((wVar18 < L'\0') && (!_Var8)) && (!_Var9)) &&
          ((!_Var7 && (_Var6 = borg_equips_item(act_haste,true), !_Var6)))) &&
         ((_Var6 = borg_equips_item(act_haste1,true), !_Var6 &&
          (_Var6 = borg_equips_item(act_haste2,true), !_Var6)))) {
        return L'\0';
      }
      if ((((_Var9 || _Var7) || _Var8) || (_Var7 = borg_equips_item(act_haste,true), _Var7)) ||
         ((_Var7 = borg_equips_item(act_haste1,true), _Var7 ||
          (_Var7 = borg_equips_item(act_haste2,true), _Var7)))) {
        bVar42 = true;
      }
      else {
        bVar42 = false;
      }
      borg.temp.fast = true;
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
      wVar14 = borg_fighting_unique;
      borg.temp.fast = false;
      if (scaryguy_on_level == true) {
        wVar18 = (wVar18 * 3) / 10;
      }
      if ((bool)(borg_fighting_unique != L'\0' & bVar42)) {
        wVar18 = (wVar18 * 7) / 10;
      }
      if ((borg_fighting_unique != L'\0' & borg_fighting_summoner) == 1) {
        wVar18 = (wVar18 * 7) / 10;
      }
      iVar34 = borg.trait[0x69];
      if (borg_fighting_unique < L'\n' || iVar34 != 99) {
        if (borg_fighting_unique == L'\0') {
          bVar41 = true;
          goto LAB_00214101;
        }
      }
      else {
        wVar18 = (wVar18 * 6) / 10;
      }
      pcVar21 = r_info[unique_on_level].name;
      iVar13 = strcmp(pcVar21,"Bullroarer the Hobbit");
      if ((((iVar13 == 0) || (iVar13 = strcmp(pcVar21,"Mughash the Kobold Lord"), iVar13 == 0)) ||
          (iVar13 = strcmp(pcVar21,"Wormtongue, Agent of Saruman"), iVar13 == 0)) ||
         (((iVar13 = strcmp(pcVar21,"Lagduf, the Snaga"), iVar13 == 0 ||
           (iVar13 = strcmp(pcVar21,"Brodda, the Easterling"), iVar13 == 0)) ||
          (iVar13 = strcmp(pcVar21,"Orfax, Son of Boldor"), iVar13 == 0)))) {
        wVar18 = (wVar18 * 6) / 10;
      }
      bVar41 = false;
LAB_00214101:
      wVar30 = wVar18 / 2;
      if (wVar14 < L'\n') {
        wVar30 = wVar18;
      }
      if (iVar34 != 100) {
        wVar30 = wVar18;
      }
      wVar18 = L'✏';
      if (wVar14 != L'\0') {
        wVar18 = wVar30;
      }
      if (iVar34 < 0x61) {
        wVar18 = wVar30;
      }
      if (bVar42) {
        wVar18 = wVar30;
      }
      wVar14 = p1 - wVar18;
      if (wVar14 == L'\0' || p1 < wVar18) {
        return L'\0';
      }
      iVar34 = (int)avoidance;
      if (bVar41) {
        wVar30 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar30 = (iVar34 * 2) / 3;
      }
      if ((wVar30 < wVar18) || (!(bool)(bVar42 & iVar34 / 5 < p1))) {
        if (bVar41) {
          wVar30 = (wchar_t)(avoidance / 3);
        }
        else {
          wVar30 = (iVar34 * 2) / 3;
        }
        if (wVar30 < wVar18) {
          return L'\0';
        }
        if (p1 <= iVar34 / 7) {
          return L'\0';
        }
      }
      if (borg_simulate == true) {
        return wVar14;
      }
      borg_note("# Attempting to cast Speed");
      borg.no_rest_prep = (short)borg.trait[0x23] * 1000;
      _Var7 = borg_zap_rod(sv_rod_speed);
      if (_Var7) {
        return wVar14;
      }
      _Var7 = borg_activate_item(act_haste);
      if (_Var7) {
        return wVar14;
      }
      _Var7 = borg_activate_item(act_haste1);
      if (_Var7) {
        return wVar14;
      }
      _Var7 = borg_activate_item(act_haste2);
      if (_Var7) {
        return wVar14;
      }
      _Var7 = borg_use_staff(sv_staff_speed);
      if (_Var7) {
        return wVar14;
      }
      _Var7 = borg_quaff_potion(sv_potion_speed);
      if (_Var7) {
        return wVar14;
      }
      _Var7 = borg_spell_fail(HASTE_SELF,wVar15);
      if (!_Var7) {
        return L'\0';
      }
      return wVar14;
    }
    break;
  case L'\x02':
    iVar34 = borg.trait[0x4e];
    iVar13 = borg.trait[0x56];
    if ((((iVar34 == 0 || iVar13 == 0) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
       (borg.trait[0x79] == 0)) {
      wVar15 = L'\x06';
      if ((p1 <= avoidance) && (wVar15 = L'\x0f', p1 <= (avoidance * 2) / 3)) {
        wVar15 = L'\x19';
        if (p1 < avoidance / 3) {
          wVar15 = L'#';
        }
      }
      _Var7 = borg_spell_okay_fail(GRIM_PURPOSE,wVar15);
      if (!_Var7) {
        return L'\0';
      }
      wVar15 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      piVar20 = borg.trait;
      borg.trait[0x4e] = 1;
      piVar20[0x56] = 1;
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      piVar20 = borg.trait;
      borg.trait[0x4e] = (uint)(iVar34 != 0);
      piVar20[0x56] = (uint)(iVar13 != 0);
      iVar34 = wVar15 - wVar18;
      if (iVar34 == 0 || wVar15 < wVar18) {
        return L'\0';
      }
      if (borg_fighting_unique == L'\0') {
        wVar14 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar14 = (avoidance * 2) / 3;
      }
      if (wVar14 < wVar18) {
        return L'\0';
      }
      if (wVar15 <= (int)avoidance / 7) {
        return L'\0';
      }
      if (borg_simulate != true) {
        borg_note("# Attempting to cast Grim Purpose");
        _Var7 = borg_spell(GRIM_PURPOSE);
        if (_Var7) {
          borg.no_rest_prep = 13000;
        }
      }
LAB_00214f6f:
      return iVar34 + L'\x02';
    }
    break;
  case L'\x03':
    if (((((borg.temp.res_fire != true) || (borg.temp.res_acid != true)) ||
         ((!borg.temp.res_pois || ((borg.temp.res_elec != true || (borg.temp.res_cold == false))))))
        && (borg.trait[0x70] == 0)) && ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      _Var7 = borg_equips_item(act_resist_all,true);
      if ((!_Var7) && (_Var7 = borg_equips_item(act_rage_bless_resist,true), !_Var7)) {
        return L'\0';
      }
      wVar14 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      _Var7 = borg.temp.res_pois;
      uVar3 = borg.temp._4_4_;
      borg.temp.res_pois = true;
      borg.temp.res_fire = true;
      borg.temp.res_cold = true;
      borg.temp.res_acid = true;
      borg.temp.res_elec = true;
      wVar15 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      wVar18 = borg_fighting_unique;
      borg.temp._4_4_ = uVar3;
      borg.temp.res_pois = _Var7;
      if ((borg_fighting_unique != L'\0') &&
         (iVar34 = strcmp(r_info[unique_on_level].name,"The Tarrasque"), iVar34 == 0)) {
        wVar15 = (wVar15 << 3) / 10;
      }
      if (0x2c < borg.trait[0x23]) {
        wVar15 = (wVar15 << 3) / 10;
      }
      iVar34 = wVar14 - wVar15;
      if (iVar34 == 0 || wVar14 < wVar15) {
        return L'\0';
      }
      if (wVar18 == L'\0') {
        wVar18 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar18 = (avoidance * 2) / 3;
      }
      if (wVar18 < wVar15) {
        return L'\0';
      }
      if (wVar14 <= (int)avoidance / 7) {
        return L'\0';
      }
      if (borg_simulate != true) {
        borg_note("# Attempting to cast FECAP");
        _Var7 = borg_activate_item(act_resist_all);
        if ((_Var7) || (_Var7 = borg_activate_item(act_rage_bless_resist), _Var7)) {
          borg.no_rest_prep = 21000;
        }
      }
      goto LAB_00214f6f;
    }
    break;
  case L'\x04':
    if (((borg.temp.res_fire == false) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      wVar15 = L'\x06';
      if ((p1 <= avoidance) && (wVar15 = L'\x0f', p1 <= (avoidance * 2) / 3)) {
        wVar15 = L'\x19';
        if (p1 < avoidance / 3) {
          wVar15 = L'#';
        }
      }
      _Var7 = borg_spell_okay_fail(RESISTANCE,wVar15);
      if ((((((!_Var7) && (_Var7 = borg_equips_item(act_resist_all,true), !_Var7)) &&
            (_Var7 = borg_equips_item(act_resist_fire,true), !_Var7)) &&
           ((_Var7 = borg_equips_item(act_rage_bless_resist,true), !_Var7 &&
            (_Var7 = borg_equips_ring(sv_ring_flames), !_Var7)))) &&
          (_Var7 = borg_equips_item(act_ring_flames,true), !_Var7)) &&
         (wVar18 = borg_slot(L'\x1a',sv_potion_resist_heat), wVar18 == L'\xffffffff')) {
        return L'\0';
      }
      wVar14 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      borg.temp.res_fire = true;
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      borg.temp._4_4_ = (uint)(uint3)borg.temp._5_3_ << 8;
      if (borg_fighting_unique == L'\0') {
        if (wVar14 <= wVar18) {
          return L'\0';
        }
        wVar30 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        iVar34 = strcmp(r_info[unique_on_level].name,"The Tarrasque");
        if (iVar34 == 0) {
          wVar18 = (wVar18 << 3) / 10;
        }
        if (wVar14 <= wVar18) break;
        wVar30 = (avoidance * 2) / 3;
      }
      if (wVar30 < wVar18) {
        return L'\0';
      }
      if (wVar14 <= (int)avoidance / 7) {
        return L'\0';
      }
      if (borg_simulate == true) goto LAB_00215485;
      borg_note("# Attempting to cast RFire");
      _Var7 = borg_activate_ring(sv_ring_flames);
      if ((_Var7) || (_Var7 = borg_activate_item(act_ring_flames), _Var7)) {
LAB_00214430:
        borg_keypress(0x2a);
        borg_keypress(0x35);
        goto LAB_00215485;
      }
      _Var7 = borg_activate_item(act_resist_all);
      if ((((!_Var7) && (_Var7 = borg_activate_item(act_resist_fire), !_Var7)) &&
          (_Var7 = borg_activate_item(act_rage_bless_resist), !_Var7)) &&
         (_Var7 = borg_spell_fail(RESISTANCE,wVar15), !_Var7)) {
        pwVar22 = &sv_potion_resist_heat;
LAB_00215473:
        _Var7 = borg_quaff_potion(*pwVar22);
        if (!_Var7) goto LAB_00215485;
      }
LAB_0021547e:
      borg.no_rest_prep = 21000;
LAB_00215485:
      return wVar14 - wVar18;
    }
    break;
  case L'\x05':
    if (((borg.temp.res_cold == false) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      wVar15 = L'\x06';
      if ((p1 <= avoidance) && (wVar15 = L'\x0f', p1 <= (avoidance * 2) / 3)) {
        wVar15 = L'\x19';
        if (p1 < avoidance / 3) {
          wVar15 = L'#';
        }
      }
      _Var7 = borg_spell_okay_fail(RESISTANCE,wVar15);
      if ((((!_Var7) && (_Var7 = borg_equips_item(act_resist_all,true), !_Var7)) &&
          (_Var7 = borg_equips_item(act_rage_bless_resist,true), !_Var7)) &&
         (((_Var7 = borg_equips_item(act_resist_cold,true), !_Var7 &&
           (_Var7 = borg_equips_ring(sv_ring_ice), !_Var7)) &&
          ((_Var7 = borg_equips_item(act_ring_ice,true), !_Var7 &&
           (wVar18 = borg_slot(L'\x1a',sv_potion_resist_cold), wVar18 == L'\xffffffff')))))) {
        return L'\0';
      }
      wVar14 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      _Var7 = borg.temp.res_cold;
      borg.temp.res_cold = true;
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      borg.temp._4_2_ = CONCAT11(_Var7,borg.temp.res_fire);
      if (borg_fighting_unique == L'\0') {
        if (wVar14 <= wVar18) {
          return L'\0';
        }
        wVar30 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        iVar34 = strcmp(r_info[unique_on_level].name,"The Tarrasque");
        if (iVar34 == 0) {
          wVar18 = (wVar18 << 3) / 10;
        }
        if (wVar14 <= wVar18) break;
        wVar30 = (avoidance * 2) / 3;
      }
      if (wVar30 < wVar18) {
        return L'\0';
      }
      if (wVar14 <= (int)avoidance / 7) {
        return L'\0';
      }
      if (borg_simulate == true) goto LAB_00215485;
      borg_note("# Attempting to cast RCold");
      _Var7 = borg_activate_ring(sv_ring_ice);
      if ((_Var7) || (_Var7 = borg_activate_item(act_ring_ice), _Var7)) goto LAB_00214430;
      _Var7 = borg_activate_item(act_resist_all);
      if ((!_Var7) &&
         (((_Var7 = borg_activate_item(act_rage_bless_resist), !_Var7 &&
           (_Var7 = borg_activate_item(act_resist_cold), !_Var7)) &&
          (_Var7 = borg_spell_fail(RESISTANCE,wVar15), !_Var7)))) {
        pwVar22 = &sv_potion_resist_cold;
        goto LAB_00215473;
      }
      goto LAB_0021547e;
    }
    break;
  case L'\x06':
    if (((borg.temp.res_acid == false) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      wVar15 = L'\x06';
      if ((p1 <= avoidance) && (wVar15 = L'\x0f', p1 <= (avoidance * 2) / 3)) {
        wVar15 = L'\x19';
        if (p1 < avoidance / 3) {
          wVar15 = L'#';
        }
      }
      _Var7 = borg_spell_okay_fail(RESISTANCE,wVar15);
      if ((((!_Var7) && (_Var7 = borg_equips_item(act_resist_acid,true), !_Var7)) &&
          (_Var7 = borg_equips_item(act_resist_all,true), !_Var7)) &&
         ((_Var7 = borg_equips_item(act_rage_bless_resist,true), !_Var7 &&
          (_Var7 = borg_equips_ring(sv_ring_acid), !_Var7)))) {
        return L'\0';
      }
      wVar15 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      _Var7 = borg.temp.res_acid;
      borg.temp.res_acid = true;
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      borg.temp._4_3_ = CONCAT12(_Var7,borg.temp._4_2_);
      wVar14 = wVar15 - wVar18;
      if (wVar14 == L'\0' || wVar15 < wVar18) {
        return L'\0';
      }
      if (borg_fighting_unique == L'\0') {
        wVar30 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar30 = (avoidance * 2) / 3;
      }
      if (wVar30 < wVar18) {
        return L'\0';
      }
      if (wVar15 <= (int)avoidance / 7) {
        return L'\0';
      }
      if (borg_simulate == true) {
        return wVar14;
      }
      borg_note("# Attempting to cast RAcid");
      _Var7 = borg_spell(RESISTANCE);
      if (_Var7) {
        return wVar14;
      }
      _Var7 = borg_activate_ring(sv_ring_acid);
      if ((_Var7) || (_Var7 = borg_activate_item(act_ring_acid), _Var7)) {
LAB_00214b2a:
        borg_keypress(0x2a);
        borg_keypress(0x35);
        return wVar14;
      }
      piVar20 = &act_resist_acid;
LAB_002154c6:
      _Var7 = borg_activate_item(*piVar20);
      if (((!_Var7) && (_Var7 = borg_activate_item(act_resist_all), !_Var7)) &&
         (_Var7 = borg_activate_item(act_rage_bless_resist), !_Var7)) {
        return wVar14;
      }
      borg.no_rest_prep = 21000;
      return wVar14;
    }
    break;
  case L'\a':
    if ((((borg.temp.res_elec == false) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
       (borg.trait[0x79] == 0)) {
      wVar15 = L'\x06';
      if ((p1 <= avoidance) && (wVar15 = L'\x0f', p1 <= (avoidance * 2) / 3)) {
        wVar15 = L'\x19';
        if (p1 < avoidance / 3) {
          wVar15 = L'#';
        }
      }
      _Var7 = borg_spell_okay_fail(RESISTANCE,wVar15);
      if (((!_Var7) && (_Var7 = borg_equips_item(act_resist_elec,true), !_Var7)) &&
         ((_Var7 = borg_equips_item(act_resist_all,true), !_Var7 &&
          (((_Var7 = borg_equips_item(act_rage_bless_resist,true), !_Var7 &&
            (_Var7 = borg_equips_ring(sv_ring_lightning), !_Var7)) &&
           (_Var7 = borg_equips_item(act_ring_lightning,true), !_Var7)))))) {
        return L'\0';
      }
      wVar15 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      _Var7 = borg.temp.res_elec;
      borg.temp.res_elec = true;
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      borg.temp._4_4_ = CONCAT13(_Var7,borg.temp._4_3_);
      wVar14 = wVar15 - wVar18;
      if (wVar14 == L'\0' || wVar15 < wVar18) {
        return L'\0';
      }
      if (borg_fighting_unique == L'\0') {
        wVar30 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar30 = (avoidance * 2) / 3;
      }
      if (wVar30 < wVar18) {
        return L'\0';
      }
      if (wVar15 <= (int)avoidance / 7) {
        return L'\0';
      }
      if (borg_simulate == true) {
        return wVar14;
      }
      borg_note("# Attempting to cast RAcid");
      _Var7 = borg_spell(RESISTANCE);
      if (_Var7) {
        return wVar14;
      }
      _Var7 = borg_activate_ring(sv_ring_lightning);
      if ((_Var7) || (_Var7 = borg_activate_item(act_ring_lightning), _Var7)) goto LAB_00214b2a;
      piVar20 = &act_resist_elec;
      goto LAB_002154c6;
    }
    break;
  case L'\b':
    if (((!borg.temp.res_pois) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      wVar15 = L'\x06';
      if ((p1 <= avoidance) && (wVar15 = L'\x0f', p1 <= (avoidance * 2) / 3)) {
        wVar15 = L'\x19';
        if (p1 < avoidance / 3) {
          wVar15 = L'#';
        }
      }
      _Var7 = borg_spell_okay_fail(RESIST_POISON,wVar15);
      if ((((!_Var7) && (_Var7 = borg_equips_item(act_resist_pois,true), !_Var7)) &&
          (_Var7 = borg_equips_item(act_resist_all,true), !_Var7)) &&
         ((_Var7 = borg_equips_item(act_rage_bless_resist,true), !_Var7 &&
          (wVar18 = borg_slot(L'\x1a',sv_potion_resist_pois), wVar18 == L'\xffffffff')))) {
        return L'\0';
      }
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      _Var7 = borg.temp.res_pois;
      borg.temp.res_pois = true;
      wVar14 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      wVar30 = wVar18 - wVar14;
      if (wVar30 == L'\0' || wVar18 < wVar14) {
        borg.temp.res_pois = _Var7;
        return L'\0';
      }
      if (borg_fighting_unique == L'\0') {
        wVar29 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar29 = (avoidance * 2) / 3;
      }
      if (wVar29 < wVar14) {
        borg.temp.res_pois = _Var7;
        return L'\0';
      }
      if (wVar18 <= (int)avoidance / 7) {
        borg.temp.res_pois = _Var7;
        return L'\0';
      }
      if (borg_simulate == true) {
        borg.temp.res_pois = _Var7;
        return wVar30;
      }
      borg.temp.res_pois = _Var7;
      borg_note("# Attempting to cast RPois");
      _Var7 = borg_spell_fail(RESIST_POISON,wVar15);
      if (((!_Var7) && (_Var7 = borg_activate_item(act_resist_pois), !_Var7)) &&
         ((_Var7 = borg_activate_item(act_resist_all), !_Var7 &&
          ((_Var7 = borg_activate_item(act_rage_bless_resist), !_Var7 &&
           (_Var7 = borg_quaff_potion(sv_potion_resist_pois), !_Var7)))))) {
        return wVar30;
      }
      borg.no_rest_prep = 21000;
      return wVar30;
    }
    break;
  case L'\t':
    if ((((!borg.temp.prot_from_evil) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
       (borg.trait[0x79] == 0)) {
      wVar15 = L'\x06';
      if ((p1 <= avoidance) && (wVar15 = L'\x14', p1 <= (avoidance * 2) / 3)) {
        wVar15 = L'\x19';
        if (p1 < avoidance / 3) {
          wVar15 = L'#';
        }
      }
      pbVar39 = borg_grids[borg.c.y];
      lVar33 = (long)borg.c.x;
      _Var7 = borg_spell_okay_fail(PROTECTION_FROM_EVIL,wVar15);
      wVar18 = borg_slot(L'\x19',sv_scroll_protection_from_evil);
      if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x78] == 0)) {
        bVar42 = L'\xffffffff' < wVar18 || _Var7;
      }
      else {
        bVar42 = false;
      }
      if (((pbVar39[lVar33].info & 2) == 0) && (borg.trait[0x1a] == 0)) {
        bVar42 = false;
      }
      _Var7 = borg_equips_item(act_protevil,true);
      if ((!_Var7) && (!bVar42)) {
        return L'\0';
      }
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      borg.temp.prot_from_evil = true;
      wVar14 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      borg.temp.prot_from_evil = false;
      wVar30 = wVar18 - wVar14;
      if (wVar30 != L'\0' && wVar14 <= wVar18) {
        if (borg_fighting_unique == L'\0') {
          wVar29 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
        }
        else {
          wVar29 = (avoidance * 2) / 3;
        }
        if ((wVar14 <= wVar29) && ((int)avoidance / 7 < wVar18)) goto LAB_00214eb4;
      }
      if (borg_cfg[0x18] < 1) {
        borg.temp.prot_from_evil = false;
        return L'\0';
      }
      if (borg.trait[0x69] != 0) {
        borg.temp.prot_from_evil = false;
        return L'\0';
      }
LAB_00214eb4:
      if (borg_simulate == true) {
        borg.temp.prot_from_evil = false;
        return wVar30;
      }
      borg_note("# Attempting to cast PFE");
      _Var7 = borg_spell_fail(PROTECTION_FROM_EVIL,wVar15);
      if (((!_Var7) && (_Var7 = borg_activate_item(act_protevil), !_Var7)) &&
         (_Var7 = borg_read_scroll(sv_scroll_protection_from_evil), !_Var7)) {
        return wVar30;
      }
      borg.no_rest_prep = (short)borg.trait[0x23] * 1000;
      return wVar30;
    }
    break;
  case L'\n':
    if (((!borg.temp.shield) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      if ((borg.has[kv_mush_stoneskin] < 1) &&
         (_Var7 = borg_equips_item(act_shroom_stone,true), !_Var7)) {
        return L'\0';
      }
      borg.temp.shield = true;
      wVar15 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
      borg.temp.shield = false;
      if (borg_fighting_unique == L'\0') {
        if (p1 <= wVar15) {
          borg.temp.shield = false;
          return L'\0';
        }
        wVar18 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar15 = (wVar15 * 7) / 10;
        if (p1 <= wVar15) {
          borg.temp.shield = false;
          return L'\0';
        }
        wVar18 = (avoidance * 2) / 3;
      }
      if (wVar18 < wVar15) {
        borg.temp.shield = false;
        return L'\0';
      }
      if (p1 <= (int)avoidance / 7) {
        borg.temp.shield = false;
        return L'\0';
      }
      if (borg_simulate != true) {
        borg_note("# Attempting to eat a stone skin");
        _Var7 = borg_eat(L'\x1d',sv_mush_stoneskin);
        if ((!_Var7) && (_Var7 = borg_activate_item(act_shroom_stone), !_Var7)) {
          return L'\0';
        }
        borg.no_rest_prep = 2000;
      }
      return p1 - wVar15;
    }
    break;
  case L'\v':
    if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) {
      iVar34 = (int)avoidance;
      if (borg_fighting_unique == L'\0') {
        wVar15 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar15 = (iVar34 * 7) / 10;
      }
      if ((((wVar15 <= p1) || (borg.trait[0x1e] < 0x1f)) || (!borg_simulate)) &&
         (((iVar34 * 4) / 10 <= p1 || (!borg_simulate)))) {
        wVar15 = L'(';
        if ((p1 <= iVar34 * 3) && (wVar15 = L'-', p1 <= iVar34 * 2)) {
          wVar15 = (uint)((wchar_t)((ulong)((uint)(iVar34 * 5) >> 0x1f) + (long)(iVar34 * 5) >> 1) <
                         p1) * 5 + L'2';
        }
        _Var7 = borg_spell_okay_fail(TELEPORT_OTHER,wVar15);
        if ((((_Var7) || (_Var7 = borg_equips_item(act_tele_other,true), _Var7)) ||
            ((wVar15 = borg_slot(L'\x17',sv_wand_teleport_away), pbVar4 = borg_items,
             wVar15 != L'\xffffffff' &&
             (wVar15 = borg_slot(L'\x17',sv_wand_teleport_away), pbVar4[wVar15].pval != 0)))) &&
           (_Var7 = borg_surrounded(), !_Var7)) {
          if ((borg_kills_cnt == 0) && (borg_simulate != false)) {
            return L'\0';
          }
          borg_temp_n = 0;
          borg_tp_other_n = 0;
          if (borg_kills_nxt < 2) {
LAB_002147c4:
            if (borg_simulate != false) {
              return L'\0';
            }
          }
          else {
            lVar36 = 1;
            lVar33 = 0x1d8;
            pbVar27 = borg_kills;
            do {
              pbVar28 = pbVar27;
              if ((*(short *)(pbVar27->spell + lVar33 + -0x19) != 0) &&
                 (borg_t + -2 <= (int)*(short *)((long)&pbVar27->when + lVar33))) {
                if (((~borg_grids[*(int *)(pbVar27->spell + lVar33 + -9)]
                       [*(int *)(pbVar27->spell + lVar33 + -0xd)].info & 0x28) == 0) &&
                   ((6 < (byte)(borg_grids[*(int *)(pbVar27->spell + lVar33 + -9)]
                                [*(int *)(pbVar27->spell + lVar33 + -0xd)].feat - 0x10) &&
                    (grid1_06.y = borg.c.y, grid1_06.x = borg.c.x,
                    wVar15 = distance(grid1_06,*(loc_conflict *)(pbVar27->spell + lVar33 + -0xd)),
                    pbVar28 = borg_kills, wVar15 <= (int)(uint)z_info->max_range)))) {
                  borg_temp_x[borg_temp_n] = pbVar27->spell[lVar33 + -0xd];
                  borg_temp_y[borg_temp_n] = pbVar27->spell[lVar33 + -9];
                  borg_temp_n = borg_temp_n + 1;
                }
              }
              lVar36 = lVar36 + 1;
              lVar33 = lVar33 + 0x1d8;
              pbVar27 = pbVar28;
            } while (lVar36 < borg_kills_nxt);
            if (borg_temp_n == 0) goto LAB_002147c4;
          }
          _Var7 = false;
          wVar15 = borg_launch_bolt(L'\0',p1,L'-',(uint)z_info->max_range,L'\0');
          if (wVar15 < L'\x01') {
            return L'\0';
          }
          if (borg_simulate == true) {
            if (wVar15 <= (int)(short)(avoidance - (avoidance >> 0xf)) >> 1) {
              borg_tp_other_n = 0;
              borg_temp_n = 0;
              return L'\0';
            }
            borg_tp_other_n = 0;
            borg_temp_n = 0;
            return wVar15;
          }
          borg_log_spellpath(_Var7);
          uVar19 = (ulong)(ushort)borg_tp_other_n;
          if (0 < borg_tp_other_n) {
            lVar33 = 0;
            do {
              pcVar21 = format("# T.O. %d, index %d (%d,%d)",(ulong)(uint)(int)(short)uVar19,
                               (ulong)(uint)borg_tp_other_index[lVar33],
                               (ulong)borg_tp_other_y[lVar33],(ulong)borg_tp_other_x[lVar33]);
              borg_note(pcVar21);
              lVar33 = lVar33 + 1;
              uVar19 = (ulong)borg_tp_other_n;
            } while (lVar33 < (long)uVar19);
          }
          borg_temp_n = 0;
          borg_tp_other_n = 0;
          _Var7 = borg_spell(TELEPORT_OTHER);
          if (((_Var7) || (_Var7 = borg_activate_item(act_tele_other), _Var7)) ||
             (_Var7 = borg_aim_wand(sv_wand_teleport_away), _Var7)) {
            borg_keypress(0x35);
            successful_target = L'\xffffffff';
            return wVar15;
          }
        }
      }
    }
    break;
  case L'\f':
    if (((!borg.temp.hero) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) {
      if (borg.trait[0x79] != 0) {
        return L'\0';
      }
      _Var7 = borg_spell_okay_fail(HEROISM,L'\x0f');
      bVar42 = false;
      if (_Var7) {
        wVar15 = borg.trait[0x23];
        wVar18 = borg_heroism_level();
        bVar42 = wVar18 <= wVar15;
      }
      wVar15 = borg_slot(L'\x1a',sv_potion_heroism);
      if (wVar15 == L'\xffffffff' && !bVar42) {
        return L'\0';
      }
      if (p1 <= (int)avoidance / 10) {
        return L'\0';
      }
      if ((int)(((uint)(borg_fighting_unique != L'\0') * 2 + 5) * (int)avoidance) / 10 <= p1) {
        return L'\0';
      }
      if (borg_simulate != false) {
        return L'\x01';
      }
      borg_note("# Attempting to cast Hero");
      if ((bVar42) && (_Var7 = borg_spell(HEROISM), _Var7)) {
        borg.no_rest_prep = 10000;
        return L'\x01';
      }
      _Var7 = borg_quaff_potion(sv_potion_heroism);
LAB_00211483:
      if (_Var7 != false) {
        borg.no_rest_prep = 10000;
        return L'\x01';
      }
      return L'\0';
    }
    break;
  case L'\r':
    if (((((!borg.temp.berserk) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
        ((borg.trait[0x79] == 0 &&
         ((((_Var7 = borg_spell_okay_fail(BERSERK_STRENGTH,L'\x0f'), _Var7 ||
            (wVar15 = borg_slot(L'\x1a',sv_potion_berserk), wVar15 != L'\xffffffff')) ||
           ((_Var7 = borg_equips_item(act_berserker,true), _Var7 ||
            ((_Var7 = borg_equips_item(act_rage_bless_resist,true), _Var7 ||
             (_Var7 = borg_equips_item(act_shero,true), _Var7)))))) && ((int)avoidance / 10 < p1))))
        )) && (p1 < (int)(((uint)(borg_fighting_unique != L'\0') * 2 + 5) * (int)avoidance) / 10)) {
      wVar15 = L'\x05';
      if (borg_simulate != false) {
        return L'\x05';
      }
      _Var7 = borg_spell(BERSERK_STRENGTH);
      if (_Var7) {
        return L'\x05';
      }
      _Var7 = borg_activate_item(act_berserker);
      if (_Var7) {
        return L'\x05';
      }
      _Var7 = borg_activate_item(act_rage_bless_resist);
      if (_Var7) {
        return L'\x05';
      }
      _Var7 = borg_activate_item(act_shero);
      if (_Var7) {
        return L'\x05';
      }
      _Var7 = borg_quaff_potion(sv_potion_berserk);
LAB_002125b1:
      if (_Var7 != false) {
        return wVar15;
      }
    }
    break;
  case L'\x0e':
    if ((((((!borg.temp.smite_evil) && (borg.trait[0xc2] == 0)) && (borg.trait[0x70] == 0)) &&
         ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) &&
        ((_Var7 = borg_spell_okay_fail(SMITE_EVIL,L'\x0f'), _Var7 &&
         ((_Var7 = near_evil(), _Var7 && ((int)avoidance / 10 < p1)))))) &&
       (p1 < (int)(((uint)(borg_fighting_unique != L'\0') * 2 + 5) * (int)avoidance) / 10)) {
      wVar15 = L'\x05';
      if (borg_simulate != false) {
        return L'\x05';
      }
      _Var7 = borg_spell(SMITE_EVIL);
      goto LAB_002125b1;
    }
    break;
  case L'\x0f':
    if (((((!borg.temp.regen) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
        ((borg.trait[0x79] == 0 && (99 < borg.trait[0x1c])))) &&
       ((_Var7 = borg_spell_okay_fail(RAPID_REGENERATION,L'\x0f'), _Var7 &&
        (((int)avoidance / 10 < p1 &&
         (p1 < (int)(((uint)(borg_fighting_unique != L'\0') * 2 + 5) * (int)avoidance) / 10)))))) {
      if (borg_simulate != false) {
        return L'\x01';
      }
      _Var7 = borg_spell(RAPID_REGENERATION);
      goto LAB_00211483;
    }
    break;
  case L'\x10':
    if ((((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) &&
        (((borg.trait[0x79] == 0 &&
          ((pbVar39 = borg_grids[borg.c.y] + borg.c.x, pbVar39->take == '\0' &&
           (pbVar39->trap == false)))) && (3 < (byte)(pbVar39->feat - 3))))) &&
       (borg_fighting_unique < L'\n')) {
      wVar15 = L'\x06';
      if ((p1 <= avoidance) && (wVar15 = L'\x14', p1 <= (avoidance * 2) / 3)) {
        wVar15 = L'\x19';
        if (p1 < avoidance / 3) {
          wVar15 = L'-';
        }
      }
      _Var7 = borg_spell_okay_fail(GLYPH_OF_WARDING,wVar15);
      wVar18 = borg_slot(L'\x19',sv_scroll_rune_of_protection);
      _Var8 = borg_equips_item(act_glyph,true);
      if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x78] == 0)) {
        if ((pbVar39->info & 2) == 0) {
          if (borg.trait[0x1a] == 0 || (!_Var8 && !_Var7) && wVar18 < L'\0') {
            return L'\0';
          }
        }
        else if ((!_Var8 && !_Var7) && wVar18 < L'\0') {
          return L'\0';
        }
        borg_on_glyph = true;
        wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
        borg_on_glyph = false;
        wVar14 = p1 - wVar18;
        if (wVar14 == L'\0' || p1 < wVar18) {
          borg_on_glyph = false;
          return L'\0';
        }
        if (borg_fighting_unique == L'\0') {
          wVar30 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
        }
        else {
          wVar30 = (avoidance * 2) / 3;
        }
        if (wVar30 < wVar18) {
          borg_on_glyph = false;
          return L'\0';
        }
        if (p1 <= (int)avoidance / 7) {
          borg_on_glyph = false;
          return L'\0';
        }
        if (borg_simulate == true) {
          borg_on_glyph = false;
          return wVar14;
        }
        _Var7 = borg_spell_fail(GLYPH_OF_WARDING,wVar15);
        if (((!_Var7) && (_Var7 = borg_read_scroll(sv_scroll_rune_of_protection), !_Var7)) &&
           (_Var7 = borg_activate_item(act_glyph), !_Var7)) {
          return L'\0';
        }
        if (0 < (long)track_glyph.num) {
          lVar33 = 0;
          do {
            if ((track_glyph.x[lVar33] == borg.c.x) && (track_glyph.y[lVar33] == borg.c.y)) {
              return wVar14;
            }
            lVar33 = lVar33 + 1;
          } while (track_glyph.num != lVar33);
        }
        if (track_glyph.size <= track_glyph.num) {
          return wVar14;
        }
        borg_note("# Noting the creation of a glyph.");
        track_glyph.x[track_glyph.num] = borg.c.x;
        track_glyph.y[track_glyph.num] = borg.c.y;
        track_glyph.num = track_glyph.num + 1;
        return wVar14;
      }
    }
    break;
  case L'\x11':
    if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) &&
       ((borg.trait[0x79] == 0 && (borg_fighting_summoner)))) {
      wVar15 = L'\v';
      if ((p1 <= avoidance) && (wVar15 = L'\x19', p1 <= (avoidance * 2) / 3)) {
        wVar15 = L'\x1e';
        if (p1 < avoidance / 3) {
          wVar15 = L'2';
        }
      }
      _Var7 = borg_spell_okay_fail(DOOR_CREATION,wVar15);
      if (!_Var7) {
        return L'\0';
      }
      iVar34 = 0;
      lVar33 = -1;
      do {
        lVar36 = -1;
        do {
          pbVar39 = borg_grids[borg.c.y + lVar36] + lVar33 + borg.c.x;
          if (((pbVar39->glyph != false) || (pbVar39->kill != '\0')) ||
             ((pbVar39->feat < 0x17 && ((0x600004U >> (pbVar39->feat & 0x1f) & 1) != 0)))) {
            iVar34 = iVar34 + 1;
          }
          if ((((pbVar39->take != '\0') || (pbVar39->trap != false)) ||
              ((byte)(pbVar39->feat - 3) < 4)) || (pbVar39->kill != '\0')) {
            iVar34 = iVar34 + 1;
          }
          lVar36 = lVar36 + 1;
        } while (lVar36 != 2);
        lVar33 = lVar33 + 1;
      } while (lVar33 != 2);
      if (iVar34 < 6) {
        borg_create_door = true;
        wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
        borg_create_door = false;
        wVar14 = p1 - wVar18;
        if (wVar14 == L'\0' || p1 < wVar18) {
          borg_create_door = false;
          return L'\0';
        }
        if (borg_fighting_unique == L'\0') {
          wVar30 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
        }
        else {
          wVar30 = (avoidance * 2) / 3;
        }
        if (wVar30 < wVar18) {
          borg_create_door = false;
          return L'\0';
        }
        if (p1 <= (int)avoidance / 7) {
          borg_create_door = false;
          return L'\0';
        }
        if (borg_simulate == true) {
          borg_create_door = false;
          return wVar14;
        }
        _Var7 = borg_spell_fail(DOOR_CREATION,wVar15);
        if (!_Var7) {
          return L'\0';
        }
        borg_needs_new_sea = true;
        breeder_level = true;
        return wVar14;
      }
    }
    break;
  case L'\x12':
    if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) &&
       ((borg.trait[0x79] == 0 &&
        (((_Var7 = borg_spell_okay_fail(MASS_BANISHMENT,L'('), _Var7 ||
          (_Var7 = borg_equips_item(act_banishment,true), _Var7)) || (borg.trait[0xf9] != 0)))))) {
      if ((p1 < (avoidance * 0xc) / 10) && (borg_simulate != false)) {
        return L'\0';
      }
      iVar34 = 0;
      iVar13 = 0;
      if (1 < borg_kills_nxt) {
        iVar13 = 0;
        lVar36 = 1;
        lVar33 = 0x1e4;
        iVar34 = 0;
        do {
          pmVar32 = r_info;
          uVar1 = *(ushort *)(borg_kills->spell + lVar33 + -0x25);
          if ((((ulong)uVar1 != 0) && ((int)(uint)uVar1 < (int)(z_info->r_max - 1))) &&
             ((grid1_02.y = borg.c.y, grid1_02.x = borg.c.x,
              wVar15 = distance(grid1_02,*(loc_conflict *)(borg_kills->spell + lVar33 + -0x19)),
              wVar15 < L'\x15' &&
              (_Var7 = flag_has_dbg(pmVar32[uVar1].flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var7))
             )) {
            wVar15 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',(wchar_t)lVar36,true,true);
            iVar34 = iVar34 + wVar15;
            iVar13 = iVar13 + 3;
          }
          lVar36 = lVar36 + 1;
          lVar33 = lVar33 + 0x1d8;
        } while (lVar36 < borg_kills_nxt);
      }
      if (borg.trait[0x1b] <= (iVar13 * 0xc) / 10) {
        return L'\0';
      }
      iVar25 = p1 - iVar34;
      if (p1 - iVar34 < 1) {
        iVar25 = 0;
      }
      wVar15 = iVar25 + iVar13;
      if (0x1a < iVar13 && L'\t' < borg_fighting_unique) {
        wVar15 = (uint)(wVar15 * 6) / 10;
      }
      wVar18 = p1 - wVar15;
      if (wVar18 == L'\0' || p1 < wVar15) {
        return L'\0';
      }
      if (borg_fighting_unique == L'\0') {
        wVar14 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar14 = (avoidance * 2) / 3;
      }
      if (wVar14 < wVar15) {
        return L'\0';
      }
      if (borg_simulate == true) {
        return wVar18;
      }
      _Var7 = borg_read_scroll(sv_scroll_mass_banishment);
      if (((!_Var7) && (_Var7 = borg_activate_item(act_banishment), !_Var7)) &&
         (_Var7 = borg_spell(MASS_BANISHMENT), !_Var7)) {
        return L'\0';
      }
      if (borg_kills_nxt < 2) {
        return wVar18;
      }
      lVar36 = 1;
      lVar33 = 0x1d8;
      do {
        uVar1 = *(ushort *)(borg_kills->spell + lVar33 + -0x19);
        if (((uVar1 != 0) && ((int)(uint)uVar1 < (int)(z_info->r_max - 1))) &&
           (_Var7 = flag_has_dbg(r_info[(uint)uVar1].flags,0xb,1,"tmp_r_ptr->flags","RF_UNIQUE"),
           !_Var7)) {
          borg_delete_kill((wchar_t)lVar36);
        }
        lVar36 = lVar36 + 1;
        lVar33 = lVar33 + 0x1d8;
      } while (lVar36 < borg_kills_nxt);
      return wVar18;
    }
    break;
  case L'\x13':
    wVar15 = L'\x06';
    if (((p1 <= avoidance) && (wVar15 = L'\x0f', p1 <= (avoidance * 2) / 3)) &&
       (wVar15 = L'\x19', p1 < avoidance / 3)) {
      wVar15 = L'#';
    }
    if (borg.trait[0x70] != 0) {
      return L'\0';
    }
    if (borg.trait[0x72] != 0) {
      return L'\0';
    }
    if (borg.trait[0x79] != 0) {
      return L'\0';
    }
    uVar1 = borg_fear_region[borg.c.y / 0xb][borg.c.x / 0xb];
    uVar2 = borg_fear_monsters[borg.c.y][borg.c.x];
    _Var7 = borg_spell_okay_fail(BANISHMENT,wVar15);
    if (((!_Var7) && (_Var7 = borg_equips_item(act_banishment,true), !_Var7)) &&
       ((_Var7 = borg_equips_staff_fail(sv_staff_banishment), !_Var7 &&
        (wVar15 = borg_slot(L'\x19',sv_scroll_banishment), wVar15 == L'\xffffffff')))) {
      return L'\0';
    }
    if (borg.trait[0x1b] < 0x4c) {
      return L'\0';
    }
    memset(local_438,0,0x3fc);
    memset(local_838,0,0x3fc);
    memset(local_c38,0,0x3fc);
    iVar34 = 0;
    if (1 < borg_kills_nxt) {
      iVar34 = 0;
      lVar33 = 1;
      lVar36 = 0x1e8;
      do {
        pbVar27 = borg_kills;
        pmVar32 = r_info;
        uVar19 = (ulong)*(ushort *)(borg_kills->spell + lVar36 + -0x29);
        if (((uVar19 != 0) &&
            ((int)(uint)*(ushort *)(borg_kills->spell + lVar36 + -0x29) < (int)(z_info->r_max - 1)))
           && (_Var7 = flag_has_dbg(r_info[uVar19].flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var7))
        {
          wVar15 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',(wchar_t)lVar33,true,true);
          wVar18 = borg_danger_one_kill
                             (*(wchar_t *)(pbVar27->spell + lVar36 + -0x19),
                              *(wchar_t *)(pbVar27->spell + lVar36 + -0x1d),L'\x01',(wchar_t)lVar33,
                              true,true);
          bVar10 = (byte)pmVar32[uVar19].d_char;
          local_438[bVar10] = local_438[bVar10] + wVar15;
          local_c38[bVar10] = local_c38[bVar10] + wVar18;
          iVar34 = iVar34 + wVar15;
          local_838[bVar10] = local_838[bVar10] + 1;
        }
        lVar33 = lVar33 + 1;
        lVar36 = lVar36 + 0x1d8;
      } while (lVar33 < borg_kills_nxt);
    }
    iVar25 = p1 - ((uint)uVar1 + (uint)uVar2);
    wVar15 = L'\x01';
    uVar40 = 0;
    uVar31 = 0;
    uVar19 = 0;
    iVar13 = 0;
    do {
      if (local_838[uVar40] != 0) {
        wVar18 = local_438[uVar40];
        wVar14 = wVar15;
        if (wVar15 < wVar18) {
          wVar14 = wVar18;
          iVar13 = iVar34 - wVar18;
        }
        uVar31 = uVar31 & 0xff;
        if (wVar15 < wVar18) {
          uVar31 = uVar40 & 0xffffffff;
        }
        wVar18 = local_c38[uVar40];
        wVar15 = wVar14;
        if (wVar14 < wVar18) {
          wVar15 = wVar18;
        }
        uVar19 = uVar19 & 0xff;
        if (wVar14 < wVar18) {
          uVar19 = uVar40 & 0xffffffff;
        }
        if (borg_simulate == false) {
          pcVar21 = format("# Race \'%c\' is a threat with total danger %d from %d individuals.",
                           uVar40 & 0xffffffff);
          borg_note(pcVar21);
        }
      }
      uVar40 = uVar40 + 1;
    } while (uVar40 != 0xff);
    uVar37 = 0;
    uVar40 = 0;
    if ((char)uVar19 != '\0') {
      uVar35 = (uint)uVar19 & 0xff;
      if (borg.trait[0x1b] < 0x177) {
        uVar35 = 0;
      }
      uVar19 = (ulong)uVar35;
      if (SBORROW4(local_c38[uVar35],borg.trait[0x1c] * 3) !=
          local_c38[uVar35] + borg.trait[0x1c] * -3 < 0) {
        uVar19 = uVar37;
      }
      uVar35 = 0;
      if ((int)(local_838[uVar19] * 0x30) / 10 < borg.trait[0x1b]) {
        uVar35 = (uint)uVar19;
      }
      uVar40 = uVar37;
      if ((((char)uVar35 != '\0') && (iVar25 <= (int)avoidance / 5)) &&
         (uVar37 = (ulong)uVar35, (int)local_838[uVar37] < 0x4b)) {
        pcVar21 = format("# Race \'%c\' is a real threat with total danger %d from %d individuals.",
                         uVar37,(ulong)(uint)local_c38[uVar37]);
        borg_note(pcVar21);
        uVar40 = uVar19;
      }
    }
    cVar38 = (char)uVar40;
    cVar23 = cVar38;
    if ((char)uVar31 == '\0') {
      uVar19 = 0;
    }
    else {
      uVar19 = uVar31 & 0xff;
      if (borg.trait[0x1b] <= (int)(local_838[uVar31 & 0xff] * 0x30) / 10) {
        uVar19 = 0;
      }
      bVar10 = (byte)uVar19;
      if ((iVar25 < (avoidance * 7) / 10) ||
         ((0x4b < borg.trait[0x69] && (iVar25 < (avoidance * 6) / 10)))) {
        bVar10 = 0;
      }
      uVar19 = (ulong)bVar10;
      if (iVar13 <= (int)(short)(avoidance - (avoidance >> 0xf)) >> 1) {
        uVar19 = 0;
      }
      if ((char)uVar19 != '\0') {
        cVar23 = (char)uVar19;
      }
    }
    if (cVar23 == '\0') {
      return L'\0';
    }
    cVar11 = (char)uVar19;
    bVar42 = cVar11 == '\0';
    wVar15 = (wchar_t)cVar23;
    if (borg_simulate == true) {
      if (cVar11 != '\0') goto LAB_00215413;
      if (cVar38 != '\0') goto LAB_00215409;
      bVar41 = true;
      bVar42 = true;
    }
    else {
      if (cVar11 != '\0') {
        pcVar21 = format("# Banishing race \'%c\' (qty:%d).  Danger after spell:%d",wVar15,
                         (ulong)local_838[uVar19],iVar13);
        borg_note(pcVar21);
      }
      if (cVar38 == '\0') {
        bVar41 = true;
      }
      else {
        uVar19 = (ulong)(uint)((int)uVar40 << 2);
        bVar41 = false;
        pcVar21 = format("# Banishing race \'%c\' (qty:%d).  Danger from them:%d",wVar15,
                         (ulong)*(uint *)((long)local_838 + uVar19),
                         (ulong)*(uint *)((long)local_c38 + uVar19));
        borg_note(pcVar21);
      }
    }
    _Var7 = borg_read_scroll(sv_scroll_banishment);
    if (((((_Var7) || (_Var7 = borg_spell(BANISHMENT), _Var7)) ||
         (_Var7 = borg_activate_item(act_banishment), _Var7)) ||
        (_Var7 = borg_use_staff(sv_staff_banishment), _Var7)) &&
       (borg_keypress(wVar15), 1 < borg_kills_nxt)) {
      lVar36 = 1;
      lVar33 = 0x1d8;
      do {
        if ((r_info[*(ushort *)(borg_kills->spell + lVar33 + -0x19)].d_char == wVar15) &&
           (_Var7 = flag_has_dbg(r_info[*(ushort *)(borg_kills->spell + lVar33 + -0x19)].flags,0xb,1
                                 ,"r_ptr->flags","RF_UNIQUE"), !_Var7)) {
          borg_delete_kill((wchar_t)lVar36);
        }
        lVar36 = lVar36 + 1;
        lVar33 = lVar33 + 0x1d8;
      } while (lVar36 < borg_kills_nxt);
    }
    if (bVar42) {
      if (bVar41) {
        return L'\0';
      }
LAB_00215409:
      return local_c38[uVar40];
    }
LAB_00215413:
    return iVar25 - iVar13;
  case L'\x14':
    if (((((0xf9 < borg.trait[0x1b]) && ((borg.trait[0x1c] * 7) / 10 <= borg.trait[0x1b])) &&
         (0x18 < borg.trait[0x69])) && ((borg.trait[0x70] == 0 && (borg.trait[0x72] == 0)))) &&
       (borg.trait[0x79] == 0)) {
      sVar24 = avoidance + 3;
      if (-1 < avoidance) {
        sVar24 = avoidance;
      }
      if ((p1 <= (int)sVar24 >> 2) &&
         (((_Var7 = borg_spell_okay_fail(BANISHMENT,L'#'), _Var7 ||
           (_Var7 = borg_equips_item(act_banishment,true), _Var7)) ||
          (_Var7 = borg_equips_staff_fail(sv_staff_banishment), _Var7)))) {
        if ((ulong)borg_nasties_num == 0) {
          return L'\0';
        }
        uVar19 = 0xffffffff;
        uVar31 = 0;
        do {
          if (borg_nasties_limit[uVar31] <= borg_nasties_count[uVar31]) {
            uVar19 = uVar31 & 0xffffffff;
          }
          uVar31 = uVar31 + 1;
        } while (borg_nasties_num != uVar31);
        iVar34 = (int)uVar19;
        if (iVar34 != -1) {
          if (borg_simulate != false) {
            return L'\n';
          }
          pcVar21 = format("# Banishing nasties \'%c\' (qty:%d).",
                           (ulong)(uint)(int)borg_nasties[iVar34],(ulong)borg_nasties_count[iVar34])
          ;
          borg_note(pcVar21);
          _Var7 = borg_activate_item(act_banishment);
          if (((_Var7) || (_Var7 = borg_use_staff(sv_staff_banishment), _Var7)) ||
             (_Var7 = borg_spell(BANISHMENT), _Var7)) {
            borg_keypress((int)borg_nasties[iVar34]);
            borg_nasties_count[iVar34] = '\0';
            if (borg_kills_nxt < 2) {
              return L'\n';
            }
            lVar33 = 1;
            lVar36 = 0x1d8;
            pbVar27 = borg_kills;
            pmVar32 = r_info;
            iVar12 = borg_kills_nxt;
            do {
              if (pmVar32[*(ushort *)(pbVar27->spell + lVar36 + -0x19)].d_char ==
                  (int)borg_nasties[iVar34]) {
                borg_delete_kill((wchar_t)lVar33);
                pbVar27 = borg_kills;
                pmVar32 = r_info;
                iVar12 = borg_kills_nxt;
              }
              lVar33 = lVar33 + 1;
              lVar36 = lVar36 + 0x1d8;
            } while (lVar33 < iVar12);
            return L'\n';
          }
        }
      }
    }
    break;
  case L'\x15':
    if (!borg_simulate) {
      borg_needs_new_sea = true;
      _Var7 = borg_spell(TREMOR);
      if (_Var7) {
        borg_keypress(0x2a);
        borg_keypress(0x35);
      }
      else {
        _Var7 = borg_spell(QUAKE);
        if (_Var7) {
          return L'✏';
        }
        _Var7 = borg_spell(GRONDS_BLOW);
        if (_Var7) {
          return L'✏';
        }
        _Var7 = borg_activate_item(act_earthquakes);
        if (_Var7) {
          return L'✏';
        }
      }
    }
    if (((((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) &&
        (((_Var7 = borg_spell_okay_fail(TREMOR,L'#'), _Var7 ||
          (_Var7 = borg_spell_okay_fail(QUAKE,L'#'), _Var7)) ||
         ((_Var7 = borg_spell_okay_fail(GRONDS_BLOW,L'#'), _Var7 ||
          (_Var7 = borg_equips_item(act_earthquakes,true), _Var7)))))) &&
       (((avoidance * 6) / 10 <= p1 || (borg_fighting_summoner == true)))) {
      wVar15 = L'✏';
      if (0 < borg_kills_nxt) {
        lVar36 = 0;
        lVar33 = 0xc;
        iVar34 = 0;
        do {
          pbVar27 = borg_kills;
          _Var7 = borg_los(borg.c.y,borg.c.x,*(wchar_t *)(borg_kills->spell + lVar33 + -0x15),
                           *(wchar_t *)(borg_kills->spell + lVar33 + -0x19));
          if ((_Var7) && (pbVar27->spell[lVar33 + -0xd] != '\0')) {
            grid2.y = borg.c.y;
            grid2.x = borg.c.x;
            wVar15 = distance(*(loc_conflict *)(pbVar27->spell + lVar33 + -0x19),grid2);
            iVar34 = iVar34 + (uint)(L'\x01' < wVar15);
          }
          lVar36 = lVar36 + 1;
          lVar33 = lVar33 + 0x1d8;
        } while (lVar36 < borg_kills_nxt);
        if (iVar34 < 4) {
          if (iVar34 == 3) {
            wVar15 = L'✏';
            if ((avoidance * 7) / 10 < p1) {
              wVar15 = p1 * 6 >> 0x1f;
              iVar34 = (p1 * 6) / 10 + wVar15;
              goto LAB_0021452b;
            }
          }
          else {
            wVar15 = L'✏';
          }
        }
        else {
          wVar15 = L'✏';
          if ((avoidance * 7) / 10 < p1) {
            iVar34 = p1 / 3 + (p1 >> 0x1f);
            wVar15 = p1;
LAB_0021452b:
            wVar15 = iVar34 - (wVar15 >> 0x1f);
          }
        }
      }
      if (p1 - wVar15 != L'\0' && wVar15 <= p1) {
        if (borg_fighting_unique == L'\0') {
          wVar18 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
        }
        else {
          wVar18 = (avoidance * 2) / 3;
        }
        if (wVar15 <= wVar18) {
          if (p1 <= (int)avoidance / 5) {
            return L'\0';
          }
          if (borg_simulate == false) {
            return L'\0';
          }
          return p1 - wVar15;
        }
      }
    }
    break;
  case L'\x16':
    if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) {
      if (!borg_simulate) {
        _Var7 = borg_spell(WORD_OF_DESTRUCTION);
        if (_Var7) {
          borg_needs_new_sea = true;
          return L'Ǵ';
        }
        _Var7 = borg_use_staff(sv_staff_destruction);
        if (!_Var7) {
          _Var7 = borg_activate_item(act_destruction2);
          if (!_Var7) {
            return L'Ǵ';
          }
          borg_needs_new_sea = true;
          return L'Ǵ';
        }
        borg_needs_new_sea = true;
        return L'Ǵ';
      }
      if (!borg_morgoth_position) {
        wVar15 = (wchar_t)avoidance;
        if (((wVar15 * 8) / 10 < p1) && (0x59 < borg.trait[0x69])) {
          if ((wVar15 < p1) || (borg.trait[0x1b] < 0x12d)) {
LAB_00214298:
            if ((((borg.trait[0xd3] == 0) && (borg.trait[0xf7] == 0)) ||
                (((L'\x04' < borg_fighting_unique || (borg.trait[0x1b] < 0x113)) ||
                 (_Var7 = borg_caution_teleport(L'K',L'\x02'), !_Var7)))) &&
               (((borg.trait[0xd4] < 2 || (borg.trait[0x1b] < 0x113)) ||
                (_Var7 = borg_caution_teleport(L'K',L'\x02'), !_Var7)))) {
              _Var7 = borg_spell_okay_fail(WORD_OF_DESTRUCTION,L'7');
              if (((_Var7) || (_Var7 = borg_equips_staff_fail(sv_staff_destruction), _Var7)) ||
                 (_Var7 = borg_equips_item(act_destruction2,true), _Var7)) {
                bVar10 = 1;
              }
              else {
                bVar10 = 0;
              }
              wVar15 = (wchar_t)avoidance;
              if ((wVar15 * 4 < p1) || ((wVar15 < p1 && (borg.trait[0x1b] < 0x97)))) {
                _Var7 = borg_equips_staff_fail(sv_staff_destruction);
                if ((bVar10 | _Var7) != 1) {
                  return L'\0';
                }
                wVar15 = (wchar_t)avoidance;
              }
              else if (bVar10 == 0) {
                return L'\0';
              }
              wVar18 = p1;
              if (p1 < wVar15 * 2) {
                wVar18 = L'\0';
              }
              if (L'\x02' < borg_fighting_unique) {
                wVar18 = p1;
              }
              if (L'\t' < borg_fighting_unique) {
                wVar18 = L'\0';
              }
              if (borg_simulate != false) {
                return wVar18;
              }
              return L'\0';
            }
          }
        }
        else if (wVar15 < p1) goto LAB_00214298;
      }
    }
    break;
  case L'\x17':
    if ((!borg_simulate) && (_Var7 = borg_spell(TELEPORT_LEVEL), _Var7)) {
      borg_needs_new_sea = true;
      return L'Ǵ';
    }
    if (((((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) &&
        (avoidance * 2 <= p1)) &&
       (((((borg.trait[0xd3] == 0 && (borg.trait[0xf7] == 0)) ||
          (_Var7 = borg_caution_teleport(L'A',L'\x02'), !_Var7)) &&
         ((borg.trait[0xd4] < 2 || (_Var7 = borg_caution_teleport(L'A',L'\x02'), !_Var7)))) &&
        ((_Var7 = borg_spell_okay_fail(TELEPORT_LEVEL,L'7'), _Var7 && (morgoth_on_level == false))))
       )) {
      if ((L'\0' < borg_fighting_unique) && (borg_as_position != false)) {
        return L'\0';
      }
      if (borg_simulate == false) {
        return L'\0';
      }
      return p1;
    }
    break;
  case L'\x18':
    if ((int)avoidance / 10 <= p1) {
      wVar15 = L'\x0f';
      if ((int)avoidance << 2 < p1) {
        wVar15 = L'\x05';
      }
      if ((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) {
        if (borg.trait[0x79] != 0) {
          return L'\0';
        }
        _Var7 = borg_equips_item(act_loskill,true);
        if ((!_Var7) || (bVar42 = true, borg.has[0x1b] < 0x65)) {
          _Var7 = borg_spell_okay_fail(BANISH_EVIL,wVar15);
          bVar42 = false;
          if (!_Var7) {
            return L'\0';
          }
        }
        bVar41 = true;
        iVar34 = 1;
        if (borg_kills_nxt < 2) {
          local_c48 = 1;
        }
        else {
          lVar33 = 1;
          lVar36 = 0x1e8;
          do {
            if ((*(short *)(borg_kills->spell + lVar36 + -0x29) != 0) &&
               (_Var7 = borg_projectable(borg.c.y,borg.c.x,
                                         *(wchar_t *)(borg_kills->spell + lVar36 + -0x19),
                                         *(wchar_t *)(borg_kills->spell + lVar36 + -0x1d)), _Var7))
            {
              wVar15 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',(wchar_t)lVar33,true,true);
              iVar34 = iVar34 + wVar15;
            }
            lVar33 = lVar33 + 1;
            lVar36 = lVar36 + 0x1d8;
          } while (lVar33 < borg_kills_nxt);
          local_c48 = iVar34;
          if (1 < borg_kills_nxt) {
            lVar33 = 1;
            lVar36 = 0x1d8;
            local_c4c = 0;
            do {
              pbVar27 = borg_kills;
              pmVar32 = r_info;
              uVar1 = *(ushort *)(borg_kills->spell + lVar36 + -0x19);
              if (((ulong)uVar1 != 0) && ((int)(uint)uVar1 < (int)(z_info->r_max - 1))) {
                wVar15 = *(wchar_t *)(borg_kills->spell + lVar36 + -0xd);
                pbVar39 = borg_grids[*(wchar_t *)(borg_kills->spell + lVar36 + -9)];
                _Var7 = borg_projectable(borg.c.y,borg.c.x,
                                         *(wchar_t *)(borg_kills->spell + lVar36 + -9),wVar15);
                if (_Var7) {
                  if (borg_simulate == false) {
                    uVar35 = *(uint *)(pbVar27->spell + lVar36 + -0xd);
                    uVar16 = *(uint *)(pbVar27->spell + lVar36 + -9);
                    pcVar21 = borg_race_name((uint)*(ushort *)(pbVar27->spell + lVar36 + -0x19));
                    wVar18 = borg_danger_one_kill
                                       (borg.c.y,borg.c.x,L'\x01',(uint)pbVar39[wVar15].kill,true,
                                        false);
                    pcVar21 = format("# Banishing Evil: (%d,%d): %s, danger %d. is considered.",
                                     (ulong)uVar16,(ulong)uVar35,pcVar21,(ulong)(uint)wVar18);
                    borg_note(pcVar21);
                  }
                  _Var7 = flag_has_dbg(pmVar32[uVar1].flags,0xb,0x3d,"r_ptr->flags","RF_EVIL");
                  if (_Var7) {
                    _Var7 = flag_has_dbg(pmVar32[uVar1].flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
                    if ((_Var7) && (0x3c < *(short *)((long)pbVar27->spell_flags + lVar36 + -8))) {
                      if (borg_simulate == false) {
                        uVar3 = *(undefined4 *)(pbVar27->spell + lVar36 + -0xd);
                        uVar35 = *(uint *)(pbVar27->spell + lVar36 + -9);
                        pcVar21 = borg_race_name((uint)*(ushort *)(pbVar27->spell + lVar36 + -0x19))
                        ;
                        wVar15 = borg_danger_one_kill
                                           (borg.c.y,borg.c.x,L'\x01',(uint)pbVar39[wVar15].kill,
                                            true,false);
                        pcVar21 = format("# Banishing Evil: (%d,%d): %s, danger %d. Unique not considered: Injury %d."
                                         ,(ulong)uVar35,uVar3,pcVar21,(ulong)(uint)wVar15);
                        goto LAB_002111f0;
                      }
                    }
                    else {
                      _Var7 = borg_cave_floor_bold
                                        (*(wchar_t *)(pbVar27->spell + lVar36 + -9),
                                         *(wchar_t *)(pbVar27->spell + lVar36 + -0xd));
                      if (_Var7) {
                        if (borg_simulate == false) {
                          uVar3 = *(undefined4 *)(pbVar27->spell + lVar36 + -0xd);
                          uVar35 = *(uint *)(pbVar27->spell + lVar36 + -9);
                          pcVar21 = borg_race_name((uint)*(ushort *)
                                                          (pbVar27->spell + lVar36 + -0x19));
                          wVar15 = borg_danger_one_kill
                                             (borg.c.y,borg.c.x,L'\x01',(uint)pbVar39[wVar15].kill,
                                              true,true);
                          pcVar21 = format("# Banishing Evil: (%d,%d): %s, danger %d. Booted.",
                                           (ulong)uVar35,uVar3,pcVar21,(ulong)(uint)wVar15);
                          borg_note(pcVar21);
                          borg_delete_kill((wchar_t)lVar33);
                        }
                        local_c4c = local_c4c + 1;
                        wVar15 = borg_danger_one_kill
                                           (borg.c.y,borg.c.x,L'\x01',(wchar_t)lVar33,true,true);
                        local_c48 = local_c48 - wVar15;
                      }
                      else if (borg_simulate == false) {
                        uVar3 = *(undefined4 *)(pbVar27->spell + lVar36 + -0xd);
                        uVar35 = *(uint *)(pbVar27->spell + lVar36 + -9);
                        pcVar21 = borg_race_name((uint)*(ushort *)(pbVar27->spell + lVar36 + -0x19))
                        ;
                        wVar15 = borg_danger_one_kill
                                           (borg.c.y,borg.c.x,L'\x01',(uint)pbVar39[wVar15].kill,
                                            true,true);
                        fmt = "# Banishing Evil: (%d,%d): %s, danger %d. Stays (in wall).";
                        goto LAB_002111dd;
                      }
                    }
                  }
                  else if (borg_simulate == false) {
                    uVar3 = *(undefined4 *)(pbVar27->spell + lVar36 + -0xd);
                    uVar35 = *(uint *)(pbVar27->spell + lVar36 + -9);
                    pcVar21 = borg_race_name((uint)*(ushort *)(pbVar27->spell + lVar36 + -0x19));
                    wVar15 = borg_danger_one_kill
                                       (borg.c.y,borg.c.x,L'\x01',(uint)pbVar39[wVar15].kill,true,
                                        false);
                    fmt = "# Banishing Evil: (%d,%d): %s, danger %d. Stays (not evil).";
LAB_002111dd:
                    pcVar21 = format(fmt,(ulong)uVar35,uVar3,pcVar21,(ulong)(uint)wVar15);
LAB_002111f0:
                    borg_note(pcVar21);
                  }
                }
              }
              lVar33 = lVar33 + 1;
              lVar36 = lVar36 + 0x1d8;
            } while (lVar33 < borg_kills_nxt);
            bVar41 = local_c4c == 0;
          }
        }
        if ((borg_simulate == false) &&
           (((bVar42 && (_Var7 = borg_activate_item(act_loskill), _Var7)) ||
            (_Var7 = borg_spell(BANISH_EVIL), _Var7)))) {
          return iVar34 - local_c48;
        }
        if (local_c48 < 1) {
          local_c48 = 0;
        }
        iVar13 = 9999;
        if (!bVar41) {
          iVar13 = local_c48;
        }
        if ((L'\t' < borg_fighting_unique) && (0xfa < borg.trait[0x1b])) {
          if (borg.trait[0x69] == 99) {
            iVar13 = 9999;
          }
          if ((0x15e < (uint)borg.trait[0x1b]) && (borg.trait[0x69] == 100)) {
            iVar13 = 9999;
          }
        }
        if (iVar34 - iVar13 == L'\0' || iVar34 < iVar13) {
          return L'\0';
        }
        if (borg_fighting_unique == L'\0') {
          iVar25 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
        }
        else {
          iVar25 = (avoidance * 2) / 3;
        }
        if (iVar25 < iVar13) {
          return L'\0';
        }
        if (borg_simulate == false) {
          return L'\0';
        }
        return iVar34 - iVar13;
      }
    }
    break;
  case L'\x19':
    if (((((borg.trait[0x79] == 0) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
        ((borg.see_inv == 0 && ((int)borg_t <= borg.need_see_invis + 5)))) && (p1 <= avoidance * 2))
    {
      pbVar39 = borg_grids[borg.c.y];
      lVar33 = (long)borg.c.x;
      wVar15 = borg_slot(L'\x1a',sv_potion_detect_invis);
      if ((((wVar15 != L'\xffffffff') ||
           (wVar15 = borg_slot(L'\x19',sv_scroll_detect_invis), wVar15 != L'\xffffffff')) ||
          ((((_Var7 = borg_equips_staff_fail(sv_staff_detect_invis), _Var7 ||
             (((_Var7 = borg_equips_staff_fail(sv_staff_detect_evil), _Var7 ||
               (_Var7 = borg_spell_okay_fail(SENSE_INVISIBLE,L'\x19'), _Var7)) ||
              (_Var7 = borg_spell_okay_fail(DETECTION,L'\x19'), _Var7)))) ||
            (((_Var7 = borg_equips_item(act_detect_invis,true), _Var7 ||
              (_Var7 = borg_equips_item(act_tmd_sinvis,true), _Var7)) ||
             (_Var7 = borg_equips_item(act_tmd_esp,true), _Var7)))) ||
           (_Var7 = borg_equips_item(act_detect_evil,true), _Var7)))) &&
         (((pbVar39[lVar33].info & 2) != 0 || (borg.trait[0x1a] != 0)))) {
        if (borg_simulate != false) {
          return L'\n';
        }
        _Var7 = borg_spell_fail(REVEAL_MONSTERS,L'\x19');
        if (((((_Var7) || (_Var7 = borg_read_scroll(sv_scroll_detect_invis), _Var7)) ||
             (_Var7 = borg_use_staff(sv_staff_detect_invis), _Var7)) ||
            ((_Var7 = borg_use_staff(sv_staff_detect_evil), _Var7 ||
             (_Var7 = borg_activate_item(act_detect_invis), _Var7)))) ||
           ((_Var7 = borg_activate_item(act_tmd_sinvis), _Var7 ||
            ((_Var7 = borg_activate_item(act_tmd_esp), _Var7 ||
             (_Var7 = borg_activate_item(act_detect_evil), _Var7)))))) {
          borg.see_inv = 3000;
        }
        else {
          _Var7 = borg_quaff_potion(sv_potion_detect_invis);
          if (_Var7) {
            borg.see_inv = 18000;
            borg.no_rest_prep = 18000;
          }
          else {
            _Var7 = borg_spell_fail(SENSE_INVISIBLE,L'\x19');
            if (!_Var7) {
              return L'\0';
            }
            borg.see_inv = 30000;
            borg.no_rest_prep = 16000;
          }
        }
        return L'\n';
      }
    }
    break;
  case L'\x1a':
    if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) {
      if (borg.need_see_invis + 2 < (int)borg_t) {
        return L'\0';
      }
      wVar15 = borg.c.y + L'\xffffffff';
      _Var7 = borg_cave_floor_bold(wVar15,borg.c.x);
      if (_Var7) {
        wVar18 = iVar13 + L'\x01';
        _Var7 = borg_cave_floor_bold(wVar18,iVar34);
        if (!_Var7) goto LAB_002138a5;
        wVar14 = iVar34 + L'\xffffffff';
        _Var7 = borg_cave_floor_bold(iVar13,wVar14);
        if (_Var7) goto LAB_002138a5;
        wVar30 = iVar34 + L'\x01';
        _Var7 = borg_cave_floor_bold(iVar13,wVar30);
        if (((_Var7) || (_Var7 = borg_cave_floor_bold(wVar18,wVar14), _Var7)) ||
           ((_Var7 = borg_cave_floor_bold(wVar18,wVar30), _Var7 ||
            (_Var7 = borg_cave_floor_bold(wVar15,wVar14), _Var7)))) goto LAB_002138a5;
        _Var7 = borg_cave_floor_bold(wVar15,wVar30);
        bVar42 = !_Var7;
      }
      else {
LAB_002138a5:
        bVar42 = false;
      }
      wVar18 = iVar34 + L'\xffffffff';
      _Var7 = borg_cave_floor_bold(iVar13,wVar18);
      if (_Var7) {
        wVar14 = iVar34 + L'\x01';
        _Var7 = borg_cave_floor_bold(iVar13,wVar14);
        if ((_Var7) && (_Var7 = borg_cave_floor_bold(wVar15,iVar34), !_Var7)) {
          wVar30 = iVar13 + L'\x01';
          _Var7 = borg_cave_floor_bold(wVar30,iVar34);
          if ((!_Var7) &&
             (((_Var7 = borg_cave_floor_bold(wVar30,wVar18), !_Var7 &&
               (_Var7 = borg_cave_floor_bold(wVar30,wVar14), !_Var7)) &&
              (_Var7 = borg_cave_floor_bold(wVar15,wVar18), !_Var7)))) {
            _Var7 = borg_cave_floor_bold(wVar15,wVar14);
            bVar42 = (bool)(!_Var7 | bVar42);
          }
        }
      }
      _Var7 = borg_cave_floor_bold(wVar15,iVar34);
      if (((_Var7) && (_Var7 = borg_cave_floor_bold(iVar13 + L'\x01',iVar34), _Var7)) &&
         (_Var7 = borg_cave_floor_bold(iVar13,wVar18), !_Var7)) {
        _Var7 = borg_cave_floor_bold(iVar13,iVar34 + L'\x01');
        bVar42 = (bool)(!_Var7 | bVar42);
      }
      _Var7 = borg_cave_floor_bold(iVar13,wVar18);
      if (((!_Var7) || (_Var7 = borg_cave_floor_bold(iVar13,iVar34 + L'\x01'), !_Var7)) ||
         (_Var7 = borg_cave_floor_bold(wVar15,iVar34), _Var7)) {
        if (bVar42) goto LAB_002139a8;
      }
      else {
        _Var7 = borg_cave_floor_bold(iVar13 + L'\x01',iVar34);
        if ((~_Var7 & 1U) != 0 || bVar42) {
LAB_002139a8:
          if (borg_simulate == true) {
            iVar34 = avoidance * 3;
            iVar13 = avoidance * 3 + 3;
            if (-1 < iVar34) {
              iVar13 = iVar34;
            }
            if (iVar13 >> 2 < p1) break;
          }
          _Var7 = borg_light_beam(true);
          if (_Var7) {
            if (borg_simulate != false) {
              return L'\n';
            }
            _Var7 = borg_light_beam(false);
            if (_Var7) {
              return L'\n';
            }
            return L'\0';
          }
        }
      }
    }
    break;
  case L'\x1b':
    iVar34 = Term->offset_x;
    wVar15 = borg_panel_wid();
    iVar34 = iVar34 / wVar15;
    iVar13 = Term->offset_y;
    wVar15 = borg_panel_hgt();
    iVar13 = iVar13 / wVar15;
    if ((0x45 < borg.trait[0x69] | borg.need_shift_panel) == 1) {
      if (((borg.trait[0x69] == 100) && (w_y == morgy_panel_y)) && (w_x == morgy_panel_x)) {
        return L'\0';
      }
      uVar35 = 0;
      if (iVar34 == 0) {
        uVar35 = 6;
      }
      if (8 < borg.c.x - 0x34U) {
        uVar35 = 0;
      }
      uVar16 = uVar35;
      if (iVar34 == 1) {
        uVar16 = 6;
      }
      if (10 < borg.c.x - 0x54U) {
        uVar16 = uVar35;
      }
      uVar35 = uVar16;
      if (iVar34 == 2) {
        uVar35 = 6;
      }
      if (7 < borg.c.x - 0x74U) {
        uVar35 = uVar16;
      }
      uVar16 = uVar35;
      if (iVar34 == 3) {
        uVar16 = 6;
      }
      if (0xb < borg.c.x - 0x94U) {
        uVar16 = uVar35;
      }
      uVar35 = uVar16;
      if (iVar34 == 4) {
        uVar35 = 4;
      }
      if (6 < borg.c.x - 0x88U) {
        uVar35 = uVar16;
      }
      uVar16 = uVar35;
      if (iVar34 == 3) {
        uVar16 = 4;
      }
      if (7 < borg.c.x - 0x67U) {
        uVar16 = uVar35;
      }
      uVar35 = uVar16;
      if (iVar34 == 2) {
        uVar35 = 4;
      }
      if (8 < borg.c.x - 0x46U) {
        uVar35 = uVar16;
      }
      uVar16 = uVar35;
      if (iVar34 == 1) {
        uVar16 = 4;
      }
      if (9 < borg.c.x - 0x25U) {
        uVar16 = uVar35;
      }
      uVar35 = uVar16;
      if (iVar13 == 0) {
        uVar35 = 2;
      }
      if (4 < borg.c.y - 0xfU) {
        uVar35 = uVar16;
      }
      uVar16 = uVar35;
      if (iVar13 == 1) {
        uVar16 = 2;
      }
      if (5 < borg.c.y - 0x19U) {
        uVar16 = uVar35;
      }
      uVar35 = uVar16;
      if (iVar13 == 2) {
        uVar35 = 2;
      }
      if (5 < borg.c.y - 0x24U) {
        uVar35 = uVar16;
      }
      uVar16 = uVar35;
      if (iVar13 == 3) {
        uVar16 = 2;
      }
      if (4 < borg.c.y - 0x30U) {
        uVar16 = uVar35;
      }
      uVar35 = uVar16;
      if (iVar13 == 4) {
        uVar35 = 8;
      }
      if (4 < borg.c.y - 0x2fU) {
        uVar35 = uVar16;
      }
      uVar16 = uVar35;
      if (iVar13 == 3) {
        uVar16 = 8;
      }
      if (4 < borg.c.y - 0x23U) {
        uVar16 = uVar35;
      }
      uVar35 = uVar16;
      if (iVar13 == 2) {
        uVar35 = 8;
      }
      if (4 < borg.c.y - 0x18U) {
        uVar35 = uVar16;
      }
      uVar16 = 8;
      if (iVar13 != 1) {
        uVar16 = uVar35;
      }
      if (4 < borg.c.y - 0xdU) {
        uVar16 = uVar35;
      }
      if (borg.need_shift_panel == false) {
        if (borg.when_shift_panel == 0) {
          if (track_step.num == 0) break;
        }
        else {
          if ((int)borg_t - (int)borg.when_shift_panel < 0xb) {
            return L'\0';
          }
          if ((int)borg_t - (int)borg_t_morgoth < 0xb) {
            return L'\0';
          }
          if (track_step.num == 0) {
            return L'\0';
          }
        }
        switch(uVar16) {
        case 2:
          _Var7 = borg_projectable_pure(borg.c.y,borg.c.x,borg.c.y + L'\x02',borg.c.x);
          if (!_Var7) {
            return L'\0';
          }
          if (track_step.y[(long)track_step.num + -1] == borg.c.y + 1) {
            return L'\0';
          }
          borg_keypress(0x4c);
          k = 0x32;
          break;
        case 4:
          _Var7 = borg_projectable_pure(borg.c.y,borg.c.x,borg.c.y,borg.c.x + L'\xfffffffe');
          if (!_Var7) {
            return L'\0';
          }
          if (track_step.x[(long)track_step.num + -1] == borg.c.x + -1) {
            return L'\0';
          }
          borg_keypress(0x4c);
          k = 0x34;
          break;
        case 6:
          _Var7 = borg_projectable_pure(borg.c.y,borg.c.x,borg.c.y,borg.c.x + L'\x02');
          if (!_Var7) {
            return L'\0';
          }
          if (track_step.x[(long)track_step.num + -1] == borg.c.x + 1) {
            return L'\0';
          }
          borg_keypress(0x4c);
          k = 0x36;
          break;
        case 8:
          _Var7 = borg_projectable_pure(borg.c.y,borg.c.x,borg.c.y + L'\xfffffffe',borg.c.x);
          if (!_Var7) {
            return L'\0';
          }
          if (track_step.y[(long)track_step.num + -1] == borg.c.y + -1) {
            return L'\0';
          }
          borg_keypress(0x4c);
          k = 0x38;
          break;
        default:
          goto switchD_00213c66_default;
        }
        borg_keypress(k);
        borg_note("# Shifted panel as a precaution.");
        borg.when_shift_panel = borg_t;
      }
      else {
        borg_keypress(0x4c);
        if (uVar16 != 0) {
          borg_keypress(uVar16 | 0x30);
        }
        borg_keypress(0xe000);
        borg_note("# Shifted panel to locate offscreen monster.");
        borg.need_shift_panel = false;
      }
      borg_keypress(0xe000);
    }
    break;
  case L'\x1c':
    if ((((borg_morgoth_position) || ((borg_as_position && (borg_t - borg_t_antisummon < 0x32)))) &&
        ((morgoth_on_level || ((borg_as_position && (borg_t - borg_t_antisummon < 0x32)))))) &&
       ((borg.trait[0x69] != 0 && (_Var7 = borg_spell_okay_fail(TELEPORT_OTHER,L'\x1e'), !_Var7))))
    {
      if (1 < borg_kills_nxt) {
        lVar33 = 1;
        lVar36 = 0x1d8;
        pbVar27 = borg_kills;
        do {
          pbVar28 = pbVar27;
          if (*(short *)(pbVar27->spell + lVar36 + -0x19) != 0) {
            uVar16 = *(wchar_t *)(pbVar27->spell + lVar36 + -0xd) - borg.c.x;
            uVar35 = -uVar16;
            if (0 < (int)uVar16) {
              uVar35 = uVar16;
            }
            uVar17 = *(wchar_t *)(pbVar27->spell + lVar36 + -9) - borg.c.y;
            uVar16 = -uVar17;
            if (0 < (int)uVar17) {
              uVar16 = uVar17;
            }
            if (uVar16 < uVar35) {
              uVar16 = uVar35;
            }
            if (((uVar16 <= z_info->max_range) &&
                (_Var7 = borg_los(borg.c.y,borg.c.x,*(wchar_t *)(pbVar27->spell + lVar36 + -9),
                                  *(wchar_t *)(pbVar27->spell + lVar36 + -0xd)),
                pbVar28 = borg_kills, _Var7)) &&
               (((borg_morgoth_id == *(ushort *)(pbVar27->spell + lVar36 + -0x19) ||
                 (pbVar27->spell[lVar36 + -1] != '\0')) && ((int)avoidance <= borg.trait[0x1b])))) {
              borg_note("# Not resting. I can see Morgoth or a shooter.");
              goto switchD_0020ff36_default;
            }
          }
          lVar33 = lVar33 + 1;
          lVar36 = lVar36 + 0x1d8;
          pbVar27 = pbVar28;
        } while (lVar33 < borg_kills_nxt);
      }
      if (borg_simulate != false) {
        return L'È';
      }
      borg_keypress(0x2c);
      pcVar21 = format("# Resting on grid (%d, %d), waiting for Morgoth.",(ulong)(uint)borg.c.y,
                       (ulong)(uint)borg.c.x);
      borg_note(pcVar21);
      return L'È';
    }
    break;
  case L'\x1d':
    if ((((borg.trait[0x69] == 100) && (morgoth_on_level)) && (borg.trait[0x70] == 0)) &&
       (((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)) &&
        ((_Var7 = borg_spell_okay_fail(TELEPORT_OTHER,L'('), _Var7 &&
         ((9 < borg.trait[0xe6] && (_Var7 = borg_surrounded(), !_Var7)))))))) {
      if ((borg_kills_cnt == 0) && (borg_simulate != false)) {
        return L'\0';
      }
      borg_temp_n = 0;
      borg_tp_other_n = 0;
      if (borg_kills_nxt < 1) {
LAB_00213698:
        if (borg_simulate != false) {
          return L'\0';
        }
      }
      else {
        lVar33 = 0;
        lVar36 = 0;
        do {
          pbVar27 = borg_kills;
          if ((((*(short *)(borg_kills->spell + lVar33 + -0x19) != 0) &&
               (borg_t + -2 <= (int)*(short *)((long)&borg_kills->when + lVar33))) &&
              ((~borg_grids[*(int *)(borg_kills->spell + lVar33 + -9)]
                 [*(int *)(borg_kills->spell + lVar33 + -0xd)].info & 0x28) == 0)) &&
             ((grid1_05.y = borg.c.y, grid1_05.x = borg.c.x,
              wVar15 = distance(grid1_05,*(loc_conflict *)(borg_kills->spell + lVar33 + -0xd)),
              wVar15 <= (int)(uint)z_info->max_range &&
              (_Var7 = borg_projectable(borg.c.y,borg.c.x,*(wchar_t *)(pbVar27->spell + lVar33 + -9)
                                        ,*(wchar_t *)(pbVar27->spell + lVar33 + -0xd)), _Var7)))) {
            borg_temp_x[borg_temp_n] = pbVar27->spell[lVar33 + -0xd];
            borg_temp_y[borg_temp_n] = pbVar27->spell[lVar33 + -9];
            borg_temp_n = borg_temp_n + 1;
          }
          lVar36 = lVar36 + 1;
          lVar33 = lVar33 + 0x1d8;
        } while (lVar36 < borg_kills_nxt);
        if (borg_temp_n == 0) goto LAB_00213698;
      }
      _Var7 = false;
      wVar18 = borg_launch_bolt(L'\0',L'2',L'.',(uint)z_info->max_range,L'\0');
      wVar15 = L'Ϩ';
      if (wVar18 < L'Ϩ') {
        wVar15 = wVar18;
      }
      borg_temp_n = 0;
      borg_tp_other_n = 0;
      if (borg_simulate != false) {
        borg_tp_other_n = 0;
        borg_temp_n = 0;
        return wVar15;
      }
      borg_log_spellpath(_Var7);
      uVar19 = (ulong)(ushort)borg_tp_other_n;
      if (0 < borg_tp_other_n) {
        lVar33 = 0;
        do {
          pcVar21 = format("# %d, index %d (%d,%d)",(ulong)(uint)(int)(short)uVar19,
                           (ulong)(uint)borg_tp_other_index[lVar33],(ulong)borg_tp_other_y[lVar33],
                           (ulong)borg_tp_other_x[lVar33]);
          borg_note(pcVar21);
          lVar33 = lVar33 + 1;
          uVar19 = (ulong)borg_tp_other_n;
        } while (lVar33 < (long)uVar19);
      }
      borg_note("# Attempting to cast T.O. for depth 100.");
      _Var7 = borg_spell(TELEPORT_OTHER);
      if (((_Var7) || (_Var7 = borg_activate_item(act_tele_other), _Var7)) ||
         (_Var7 = borg_aim_wand(sv_wand_teleport_away), _Var7)) {
        borg_keypress(0x35);
        successful_target = L'\xffffffff';
        return wVar15;
      }
    }
    break;
  case L'\x1e':
    if ((((morgoth_on_level) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
       (borg.trait[0x79] == 0)) {
      _Var7 = borg_spell_okay_fail(BANISH_EVIL,L'2');
      _Var8 = borg_spell_okay_fail(MASS_BANISHMENT,L'2');
      if ((_Var8 || _Var7) && ((borg_kills_cnt != 0 || (borg_simulate == false)))) {
        if (borg_kills_nxt < 2) {
          local_c68 = 0;
        }
        else {
          local_c68 = 0;
          lVar33 = 1;
          lVar36 = 0x1d8;
          do {
            pbVar27 = borg_kills;
            uVar1 = *(ushort *)(borg_kills->spell + lVar36 + -0x19);
            if (((uVar1 != 0) && ((int)(uint)uVar1 < (int)(z_info->r_max - 1))) &&
               ((borg_t + -2 <= (int)*(short *)((long)&borg_kills->when + lVar36) &&
                ((((_Var8 || !_Var7 ||
                   (_Var9 = flag_has_dbg(r_info[(uint)uVar1].flags,0xb,0x3d,"r_ptr->flags","RF_EVIL"
                                        ), _Var9)) &&
                  (grid1_03.y = borg.c.y, grid1_03.x = borg.c.x,
                  wVar15 = distance(grid1_03,*(loc_conflict *)(pbVar27->spell + lVar36 + -0xd)),
                  wVar15 <= (int)(uint)z_info->max_range)) &&
                 (_Var9 = borg_projectable(borg.c.y,borg.c.x,
                                           *(wchar_t *)(pbVar27->spell + lVar36 + -9),
                                           *(wchar_t *)(pbVar27->spell + lVar36 + -0xd)), _Var9)))))
               ) {
              grid1_04.y = borg.c.y;
              grid1_04.x = borg.c.x;
              wVar15 = distance(grid1_04,*(loc_conflict *)(pbVar27->spell + lVar36 + -0xd));
              local_c68 = (ulong)((int)local_c68 + (uint)(wVar15 < L'\b') + 1);
            }
            lVar33 = lVar33 + 1;
            lVar36 = lVar36 + 0x1d8;
          } while (lVar33 < borg_kills_nxt);
          if (7 < (int)local_c68) {
            wVar15 = L'ל';
            goto LAB_0021486b;
          }
        }
        wVar15 = L'\0';
LAB_0021486b:
        if ((borg_simulate & 1U) != 0) {
          return wVar15;
        }
        pcVar21 = format("# Attempting to cast Banishment for depth 100.  %d monsters ",local_c68);
        borg_note(pcVar21);
        _Var7 = borg_spell(MASS_BANISHMENT);
        if ((!_Var7) && (_Var7 = borg_spell(BANISH_EVIL), !_Var7)) {
          return L'\0';
        }
        if (borg_kills_nxt < 1) {
          return L'Ϩ';
        }
        lVar33 = 0;
        lVar36 = 0;
        do {
          uVar1 = *(ushort *)(borg_kills->spell + lVar33 + -0x19);
          if (((uVar1 != 0) && ((int)(uint)uVar1 < (int)(z_info->r_max - 1))) &&
             (_Var7 = flag_has_dbg(r_info[(uint)uVar1].flags,0xb,1,"tmp_r_ptr->flags","RF_UNIQUE"),
             !_Var7)) {
            borg_delete_kill((wchar_t)lVar36);
          }
          lVar36 = lVar36 + 1;
          lVar33 = lVar33 + 0x1d8;
        } while (lVar36 < borg_kills_nxt);
        return L'Ϩ';
      }
    }
    break;
  case L'\x1f':
    if ((((((borg_morgoth_position) && (morgoth_on_level)) && (borg.trait[0x70] == 0)) &&
         ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) &&
        ((_Var7 = borg_spell_okay_fail(SPEAR_OF_LIGHT,L'2'), _Var7 ||
         ((_Var7 = borg_spell_okay_fail(CLAIRVOYANCE,L'2'), _Var7 ||
          (_Var7 = borg_spell_okay_fail(FUME_OF_MORDOR,L'2'), _Var7)))))) &&
       ((local_c58 = (_Bool *)&borg_kills_cnt, borg_kills_cnt != 0 ||
        (local_c58 = &borg_simulate, borg_simulate == false)))) {
      p_Var5 = (_Bool *)puVar26;
      if (borg_kills_nxt < 2) {
LAB_00214b51:
        local_c58 = p_Var5;
        wVar15 = L'\0';
      }
      else {
        local_c5c = 0;
        lVar36 = 1;
        lVar33 = 0x1d8;
        do {
          pbVar27 = borg_kills;
          if (((*(ushort *)(borg_kills->spell + lVar33 + -0x19) != 0) &&
              (borg_morgoth_id == *(ushort *)(borg_kills->spell + lVar33 + -0x19))) &&
             (borg_t + -2 <= (int)*(short *)((long)&borg_kills->when + lVar33))) {
            wVar15 = *(wchar_t *)(borg_kills->spell + lVar33 + -0xd);
            wVar18 = *(wchar_t *)(borg_kills->spell + lVar33 + -9);
            grid1_00.y = borg.c.y;
            grid1_00.x = borg.c.x;
            wVar14 = distance(grid1_00,*(loc_conflict *)(borg_kills->spell + lVar33 + -0xd));
            if (((wVar14 <= (int)(uint)z_info->max_range) &&
                (grid1_01.y = borg.c.y, grid1_01.x = borg.c.x,
                wVar14 = distance(grid1_01,*(loc_conflict *)(pbVar27->spell + lVar33 + -0xd)),
                L'\x05' < wVar14)) &&
               (_Var7 = borg_projectable_dark(borg.c.y,borg.c.x,wVar18,wVar15), _Var7)) {
              local_c5c = local_c5c + 1;
              local_c58 = (_Bool *)(ulong)(uint)wVar18;
              local_c50 = wVar15;
            }
          }
          lVar36 = lVar36 + 1;
          lVar33 = lVar33 + 0x1d8;
        } while (lVar36 < borg_kills_nxt);
        p_Var5 = local_c58;
        if (local_c5c < 1) goto LAB_00214b51;
        wVar15 = L'Ǵ';
      }
      if ((borg_simulate & 1U) != 0) {
        return wVar15;
      }
      pcVar21 = format("# Attempting to Illuminate a Pathway to (%d, %d)",
                       (ulong)local_c58 & 0xffffffff,(ulong)(uint)local_c50);
      borg_note(pcVar21);
      borg_target((loc_conflict)((ulong)(uint)local_c50 | (long)local_c58 << 0x20));
      _Var7 = borg_spell(SPEAR_OF_LIGHT);
      if (((_Var7) || (_Var7 = borg_spell(CLAIRVOYANCE), _Var7)) ||
         (_Var7 = borg_spell(FUME_OF_MORDOR), _Var7)) {
        borg_keypress(0x35);
        return L'È';
      }
    }
  }
switchD_0020ff36_default:
switchD_00213c66_default:
  return L'\0';
}

Assistant:

static int borg_calculate_defense_effectiveness(int what, int p1)
{
    /* Analyze */
    switch (what) {
    case BD_SPEED: {
        return (borg_defend_aux_speed(p1));
    }
    case BD_PROT_FROM_EVIL: {
        return (borg_defend_aux_prot_evil(p1));
    }
    case BD_GRIM_PURPOSE: {
        return (borg_defend_aux_grim_purpose(p1));
    }
    case BD_RESIST_FECAP: {
        return (borg_defend_aux_resist_fecap(p1));
    }
    case BD_RESIST_F: {
        return (borg_defend_aux_resist_f(p1));
    }
    case BD_RESIST_C: {
        return (borg_defend_aux_resist_c(p1));
    }
    case BD_RESIST_A: {
        return (borg_defend_aux_resist_a(p1));
    }
    case BD_RESIST_E: {
        return (borg_defend_aux_resist_e(p1));
    }
    case BD_RESIST_P: {
        return (borg_defend_aux_resist_p(p1));
    }
    case BD_BLESS: {
        return (borg_defend_aux_bless(p1));
    }
    case BD_HERO: {
        return (borg_defend_aux_hero(p1));
    }
    case BD_BERSERK: {
        return (borg_defend_aux_berserk(p1));
    }
    case BD_SMITE_EVIL: {
        return (borg_defend_aux_smite_evil(p1));
    }
    case BD_REGEN: {
        return (borg_defend_aux_regen(p1));
    }
    case BD_SHIELD: {
        return (borg_defend_aux_shield(p1));
    }
    case BD_TELE_AWAY: {
        return (borg_defend_aux_tele_away(p1));
    }
    case BD_GLYPH: {
        return (borg_defend_aux_glyph(p1));
    }
    case BD_CREATE_DOOR: {
        return (borg_defend_aux_create_door(p1));
    }
    case BD_MASS_GENOCIDE: {
        return (borg_defend_aux_mass_genocide(p1));
    }
    case BD_GENOCIDE: {
        return (borg_defend_aux_genocide(p1));
    }
    case BD_GENOCIDE_NASTIES: {
        return (borg_defend_aux_genocide_nasties(p1));
    }
    case BD_EARTHQUAKE: {
        return (borg_defend_aux_earthquake(p1));
    }
    case BD_TPORTLEVEL: {
        return (borg_defend_aux_teleportlevel(p1));
    }
    case BD_DESTRUCTION: {
        return (borg_defend_aux_destruction(p1));
    }
    case BD_BANISHMENT: {
        return (borg_defend_aux_banishment(p1));
    }
    case BD_DETECT_INVISO: {
        return (borg_defend_aux_inviso(p1));
    }
    case BD_LIGHT_BEAM: {
        return (borg_defend_aux_lbeam(p1));
    }
    case BD_SHIFT_PANEL: {
        return (borg_defend_aux_panel_shift());
    }
    case BD_REST: {
        return (borg_defend_aux_rest());
    }
    case BD_TELE_AWAY_MORGOTH: {
        return (borg_defend_aux_tele_away_morgoth());
    }
    case BD_BANISHMENT_MORGOTH: {
        return (borg_defend_aux_banishment_morgoth());
    }
    case BD_LIGHT_MORGOTH: {
        return (borg_defend_aux_light_morgoth());
    }
    }
    return 0;
}